

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
::emplace_at<std::pair<cs_impl::any_const,cs_impl::any>const&>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
           *this,size_t i,pair<const_cs_impl::any,_cs_impl::any> *args)

{
  allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *in_RDI;
  slot_type *in_stack_ffffffffffffffd8;
  
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  ::alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *)0x47fe52);
  hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,void>::
  construct<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>,std::pair<cs_impl::any_const,cs_impl::any>const&>
            (in_RDI,in_stack_ffffffffffffffd8,(pair<const_cs_impl::any,_cs_impl::any> *)0x47fe74);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}